

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTessellation.cpp
# Opt level: O2

void __thiscall
glcts::TessellationShaderTessellationMaxInOut::initReferenceValues
          (TessellationShaderTessellationMaxInOut *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  GLfloat *pGVar6;
  ResourceError *this_00;
  ulong uVar7;
  long lVar8;
  int i;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  GLfloat sumInTES [4];
  GLfloat sumInTCS [4];
  
  iVar1 = this->m_gl_max_tess_control_input_components_value;
  iVar2 = this->m_gl_max_tess_control_output_components_value;
  iVar3 = this->m_gl_max_tess_evaluation_input_components_value;
  iVar4 = this->m_gl_max_tess_evaluation_output_components_value;
  iVar5 = iVar4;
  if (iVar4 < iVar3) {
    iVar5 = iVar3;
  }
  if (iVar5 < iVar2) {
    iVar5 = iVar2;
  }
  if (iVar5 < iVar1) {
    iVar5 = iVar1;
  }
  pGVar6 = (GLfloat *)malloc((long)iVar5 << 2);
  this->m_ref_vertex_attributes = pGVar6;
  if (pGVar6 != (GLfloat *)0x0) {
    sumInTCS[0] = 0.0;
    sumInTCS[1] = 0.0;
    sumInTCS[2] = 0.0;
    sumInTCS[3] = 0.0;
    sumInTES[0] = 0.0;
    sumInTES[1] = 0.0;
    sumInTES[2] = 0.0;
    sumInTES[3] = 0.0;
    uVar11 = iVar1 - 4;
    uVar9 = 0;
    uVar7 = 0;
    if (0 < (int)uVar11) {
      uVar7 = (ulong)uVar11;
    }
    for (; uVar7 != uVar9; uVar9 = uVar9 + 1) {
      pGVar6[uVar9] = (float)(int)uVar9;
    }
    for (uVar9 = 0; uVar7 != uVar9; uVar9 = uVar9 + 1) {
      uVar10 = (uint)uVar9 & 3;
      sumInTCS[uVar10] = pGVar6[uVar9] + sumInTCS[uVar10];
    }
    uVar10 = iVar2 - 4;
    uVar7 = 0;
    uVar9 = 0;
    if (0 < (int)uVar10) {
      uVar9 = (ulong)uVar10;
    }
    for (; uVar9 != uVar7; uVar7 = uVar7 + 1) {
      pGVar6[uVar7] = (float)(int)(uint)uVar7 + sumInTCS[(uint)uVar7 & 3];
    }
    for (lVar8 = (long)(int)uVar11; lVar8 < (int)uVar10; lVar8 = lVar8 + 1) {
      pGVar6[lVar8] = (float)(int)lVar8;
    }
    uVar11 = iVar3 - 4;
    uVar7 = 0;
    uVar9 = 0;
    if (0 < (int)uVar11) {
      uVar9 = (ulong)uVar11;
    }
    for (; uVar9 != uVar7; uVar7 = uVar7 + 1) {
      uVar10 = (uint)uVar7 & 3;
      sumInTES[uVar10] = pGVar6[uVar7] + sumInTES[uVar10];
    }
    uVar10 = iVar4 - 4;
    uVar7 = 0;
    uVar9 = 0;
    if (0 < (int)uVar10) {
      uVar9 = (ulong)uVar10;
    }
    for (; uVar9 != uVar7; uVar7 = uVar7 + 1) {
      pGVar6[uVar7] = (float)(int)(uint)uVar7 + sumInTES[(uint)uVar7 & 3];
    }
    for (lVar8 = (long)(int)uVar11; lVar8 < (int)uVar10; lVar8 = lVar8 + 1) {
      pGVar6[lVar8] = (float)(int)lVar8;
    }
    pGVar6[(int)uVar10] = 0.0;
    pGVar6[iVar4 + -3] = 0.0;
    pGVar6[iVar4 + -2] = 0.0;
    pGVar6[iVar4 + -1] = 1.0;
    this->m_ref_patch_attributes[0] = 0.0;
    this->m_ref_patch_attributes[1] = 0.0;
    this->m_ref_patch_attributes[2] = 0.0;
    this->m_ref_patch_attributes[3] = 0.0;
    uVar10 = 0;
    uVar11 = this->m_gl_max_tess_patch_components_value;
    if (this->m_gl_max_tess_patch_components_value < 1) {
      uVar11 = uVar10;
    }
    for (; uVar11 != uVar10; uVar10 = uVar10 + 1) {
      this->m_ref_patch_attributes[uVar10 & 3] =
           (float)(int)uVar10 + this->m_ref_patch_attributes[uVar10 & 3];
    }
    return;
  }
  this_00 = (ResourceError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)sumInTCS,"Unable to allocate memory!",(allocator<char> *)sumInTES);
  tcu::ResourceError::ResourceError(this_00,(string *)sumInTCS);
  __cxa_throw(this_00,&tcu::ResourceError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void TessellationShaderTessellationMaxInOut::initReferenceValues(void)
{
	/* Allocate vertex attribute array data needed for reference values preparation. */
	int max_array_size = de::max(m_gl_max_tess_control_input_components_value,
								 de::max(m_gl_max_tess_control_output_components_value,
										 de::max(m_gl_max_tess_evaluation_input_components_value,
												 m_gl_max_tess_evaluation_output_components_value)));

	m_ref_vertex_attributes = (glw::GLfloat*)malloc(sizeof(glw::GLfloat) * (max_array_size));
	if (m_ref_vertex_attributes == DE_NULL)
	{
		throw tcu::ResourceError("Unable to allocate memory!");
	}

	/* We need to create an array consisting of gl_max_tess_evaluation_output_components items.
	 * The array will be filled with the following values:
	 *
	 * reference_value[0],
	 * (...)
	 * reference_value[gl_max_tess_evaluation_output_components / 4 - 2],
	 * reference_gl_Position
	 *
	 * which corresponds to output block defined for Tessellation Evaluation Stage:
	 *
	 * out Vertex
	 * {
	 *     vec4 value[(gl_MaxTessControlInputComponents) / 4 - 1];
	 * } outVertex;
	 *
	 * + gl_Position.
	 */
	glw::GLfloat sumInTCS[] = { 0.0f, 0.0f, 0.0f, 0.0f };
	glw::GLfloat sumInTES[] = { 0.0f, 0.0f, 0.0f, 0.0f };

	for (int i = 0; i < m_gl_max_tess_control_input_components_value - 4; /* gl_Position */
		 i++)
	{
		m_ref_vertex_attributes[i] = (glw::GLfloat)i;
	}

	for (int i = 0; i < m_gl_max_tess_control_input_components_value - 4; /* gl_Position */
		 i++)
	{
		sumInTCS[i % 4 /* component selector */] += m_ref_vertex_attributes[i];
	}

	for (int i = 0; i < m_gl_max_tess_control_output_components_value - 4; /* gl_Position */
		 i++)
	{
		m_ref_vertex_attributes[i] = sumInTCS[i % 4] + (glw::GLfloat)i;
	}

	for (int i = m_gl_max_tess_control_input_components_value - 4; /* gl_Position */
		 i < m_gl_max_tess_control_output_components_value - 4;	/* gl_Position */
		 i++)
	{
		m_ref_vertex_attributes[i] = (glw::GLfloat)i;
	}

	for (int i = 0; i < m_gl_max_tess_evaluation_input_components_value - 4; /* gl_Position */
		 i++)
	{
		sumInTES[i % 4 /* component selector */] += m_ref_vertex_attributes[i];
	}

	for (int i = 0; i < m_gl_max_tess_evaluation_output_components_value - 4; /* gl_Position */
		 i++)
	{
		m_ref_vertex_attributes[i] = sumInTES[i % 4 /* component selector */] + (glw::GLfloat)i;
	}

	for (int i = m_gl_max_tess_evaluation_input_components_value - 4; /* gl_Position */
		 i < m_gl_max_tess_evaluation_output_components_value - 4;	/* gl_Position */
		 i++)
	{
		m_ref_vertex_attributes[i] = (glw::GLfloat)i;
	}

	/* Store gl_Position reference values (only first vertex will be compared) */
	m_ref_vertex_attributes[m_gl_max_tess_evaluation_output_components_value - 4] = 0.0f;
	m_ref_vertex_attributes[m_gl_max_tess_evaluation_output_components_value - 3] = 0.0f;
	m_ref_vertex_attributes[m_gl_max_tess_evaluation_output_components_value - 2] = 0.0f;
	m_ref_vertex_attributes[m_gl_max_tess_evaluation_output_components_value - 1] = 1.0f;

	/* Set up reference data for case 2
	 *
	 * Only one output vector will be needed for comparison.
	 */
	m_ref_patch_attributes[0] = 0.0f;
	m_ref_patch_attributes[1] = 0.0f;
	m_ref_patch_attributes[2] = 0.0f;
	m_ref_patch_attributes[3] = 0.0f;

	for (int i = 0; i < m_gl_max_tess_patch_components_value; i++)
	{
		m_ref_patch_attributes[i % 4] += (glw::GLfloat)i;
	}
}